

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001705c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001705c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001705b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001705b8 = 0x2d2d2d2d2d2d2d;
    DAT_001705bf = 0x2d;
    _DAT_001705a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001705a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00170590 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170598 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000170588 = 0x2d2d2d2d2d2d2d2d;
    DAT_001705cf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }